

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall
CVmObjLookupTable::add_undo_rec
          (CVmObjLookupTable *this,vm_obj_id_t self,lookuptab_undo_action action,vm_val_t *key,
          vm_val_t *old_entry_val)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  int iVar3;
  lookuptab_undo_action *key_00;
  vm_val_t nil_val;
  vm_val_t local_38;
  
  key_00 = (lookuptab_undo_action *)malloc(0x18);
  local_38.typ = VM_NIL;
  if (key == (vm_val_t *)0x0) {
    key = &local_38;
  }
  if (old_entry_val == (vm_val_t *)0x0) {
    old_entry_val = &local_38;
  }
  *key_00 = action;
  uVar2 = *(undefined4 *)&key->field_0x4;
  aVar1 = key->val;
  key_00[2] = key->typ;
  key_00[3] = uVar2;
  *(anon_union_8_8_cb74652f_for_val *)(key_00 + 4) = aVar1;
  iVar3 = CVmUndo::add_new_record_ptr_key(G_undo_X,self,key_00,old_entry_val);
  if (iVar3 == 0) {
    free(key_00);
  }
  return;
}

Assistant:

void CVmObjLookupTable::add_undo_rec(VMG_ vm_obj_id_t self,
                                     lookuptab_undo_action action,
                                     const vm_val_t *key,
                                     const vm_val_t *old_entry_val)
{
    lookuptab_undo_rec *rec;
    vm_val_t nil_val;

    /* allocate our record extension */
    rec = (lookuptab_undo_rec *)t3malloc(sizeof(lookuptab_undo_rec));

    /* if either the key or old value are null pointers, use a nil value */
    nil_val.set_nil();
    if (key == 0)
        key = &nil_val;
    if (old_entry_val == 0)
        old_entry_val = &nil_val;

    /* set up the record */
    rec->action = action;
    rec->key = *key;

    /* add the record to the global undo stream */
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec, old_entry_val))
    {
        /* 
         *   we didn't add an undo record, so our extra undo information
         *   isn't actually going to be stored in the undo system - hence we
         *   must delete our extra information 
         */
        t3free(rec);
    }
}